

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_load.c
# Opt level: O2

void LoadExtByName(char *extensionName)

{
  code *pcVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0x10;
  while( true ) {
    if ((int)lVar3 == 0x118) {
      return;
    }
    iVar2 = strcmp(extensionName,*(char **)((long)&PTR_typeinfo_name_007c56e0 + lVar3));
    if (iVar2 == 0) break;
    lVar3 = lVar3 + 0x18;
  }
  pcVar1 = *(code **)((long)&ExtensionMap[0].extensionName + lVar3);
  if (pcVar1 == (code *)0x0) {
    iVar2 = 1;
  }
  else {
    iVar2 = (*pcVar1)();
    iVar2 = iVar2 + 1;
  }
  **(int **)((long)&PTR_typeinfo_007c56e8 + lVar3) = iVar2;
  return;
}

Assistant:

static void LoadExtByName(const char *extensionName)
{
	ogl_StrToExtMap *entry = NULL;
	entry = FindExtEntry(extensionName);
	if(entry)
	{
		if(entry->LoadExtension)
		{
			int numFailed = entry->LoadExtension();
			if(numFailed == 0)
			{
				*(entry->extensionVariable) = ogl_LOAD_SUCCEEDED;
			}
			else
			{
				*(entry->extensionVariable) = ogl_LOAD_SUCCEEDED + numFailed;
			}
		}
		else
		{
			*(entry->extensionVariable) = ogl_LOAD_SUCCEEDED;
		}
	}
}